

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemoScripts.cpp
# Opt level: O3

float SoftMaxLoss(vector<float,_std::allocator<float>_> *output,Target classId,
                 vector<float,_std::allocator<float>_> *softMax,
                 vector<float,_std::allocator<float>_> *deltas,float *S)

{
  float *pfVar1;
  float *pfVar2;
  pointer pfVar3;
  iterator iVar4;
  ulong uVar5;
  float *pfVar6;
  float fVar7;
  float local_70;
  float local_68;
  float local_64;
  float *local_60;
  undefined1 local_58 [16];
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pfVar6 = (output->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pfVar1 = (output->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pfVar6 != pfVar1) {
    iVar4._M_current =
         (softMax->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    local_70 = 0.0;
    local_60 = S;
    do {
      local_64 = expf(*pfVar6);
      if (iVar4._M_current ==
          (softMax->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (softMax,iVar4,&local_64);
        iVar4._M_current =
             (softMax->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
      }
      else {
        *iVar4._M_current = local_64;
        iVar4._M_current = iVar4._M_current + 1;
        (softMax->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
        ._M_finish = iVar4._M_current;
      }
      pfVar2 = local_60;
      local_70 = local_70 + iVar4._M_current[-1];
      pfVar6 = pfVar6 + 1;
    } while (pfVar6 != pfVar1);
    if ((output->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_finish !=
        (output->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_start) {
      local_48 = 0.0;
      uStack_44 = 0;
      uStack_40 = 0;
      uStack_3c = 0;
      uVar5 = 0;
      do {
        local_68 = (float)(-(uint)(ABS(classId - (float)(int)uVar5) < 1e-05) & 0x3f800000);
        pfVar3 = (softMax->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        fVar7 = pfVar3[uVar5];
        pfVar3[uVar5] = fVar7 / local_70;
        local_58 = ZEXT416((uint)local_68);
        local_68 = fVar7 / local_70 - local_68;
        iVar4._M_current =
             (deltas->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (deltas->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                    (deltas,iVar4,&local_68);
          pfVar3 = (softMax->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        }
        else {
          *iVar4._M_current = local_68;
          (deltas->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        *pfVar2 = pfVar3[uVar5] *
                  (deltas->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar5] + *pfVar2;
        fVar7 = logf(pfVar3[uVar5]);
        local_48 = local_48 + fVar7 * (float)local_58._0_4_;
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)((long)(output->super__Vector_base<float,_std::allocator<float>_>).
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)(output->super__Vector_base<float,_std::allocator<float>_>).
                                     _M_impl.super__Vector_impl_data._M_start >> 2));
      goto LAB_0010ce21;
    }
  }
  local_48 = 0.0;
LAB_0010ce21:
  return -local_48;
}

Assistant:

float SoftMaxLoss( const std::vector<float> &output, SPIKING_NN::Target classId,
                   std::vector<float> &softMax, std::vector<float> &deltas, float *S )
{
    float expSum = 0;
    float loss = 0;
    for ( auto activation: output ) {
        // TODO: make some exps on final target (important to understand everything around gradients formulas)
        softMax.emplace_back( exp( activation ));
        expSum += softMax.back();
    }
    for ( int neuronId = 0; neuronId < output.size(); neuronId++ ) {
        auto target = static_cast<float>( abs( classId - neuronId ) < SPIKING_NN::EPS );
        softMax[neuronId] /= expSum;
        deltas.emplace_back( softMax[neuronId] - target );
        *S += softMax[neuronId] * deltas[neuronId];
        loss += target * log( softMax[neuronId] );
    }
    return -loss;
}